

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationCannotUseReservedNumber_Test::
~CommandLineInterfaceTest_ExtensionDeclarationCannotUseReservedNumber_Test
          (CommandLineInterfaceTest_ExtensionDeclarationCannotUseReservedNumber_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtensionDeclarationCannotUseReservedNumber) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [
        declaration = {
          number: 5000,
          reserved: true
          full_name: ".foo.o"
          type: "int32"
        }];
    }

    extend Foo {
      optional int32 o = 5000;
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Cannot use number 5000 for extension field foo.o, as it is reserved in "
      "the extension declarations for message foo.Foo.");
}